

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  TestCaseInfo *pTVar1;
  pointer pcVar2;
  pointer pSVar3;
  pointer pSVar4;
  string *psVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  pointer this_00;
  SectionInfo testCaseSection;
  Counts diff;
  SectionStats testCaseSectionStats;
  string *local_148;
  string local_138;
  string *local_118;
  string *local_110;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [24];
  ostream *poStack_c0;
  ostream *local_b8;
  ostream *poStack_b0;
  streambuf *local_a8;
  size_t sStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ostream *local_88;
  undefined1 local_80;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  pTVar1 = this->m_activeTestCase->m_info;
  pcVar2 = (pTVar1->name)._M_dataplus._M_p;
  local_118 = (string *)local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  psVar5 = local_110;
  local_148 = &local_138;
  if (local_118 == (string *)local_108) {
    local_138._M_string_length = local_108._8_8_;
  }
  else {
    local_148 = local_118;
  }
  local_138._M_dataplus._M_p._1_7_ = local_108._1_7_;
  local_138._M_dataplus._M_p._0_1_ = local_108[0];
  local_110 = (string *)0x0;
  local_108[0] = 0;
  local_138.field_2._M_allocated_capacity = (size_type)(pTVar1->lineInfo).file;
  local_138.field_2._8_8_ = (pTVar1->lineInfo).line;
  local_118 = (string *)local_108;
  (*((this->m_reporter).m_ptr)->_vptr_IEventListener[7])();
  local_58 = (this->m_totals).assertions.passed;
  uStack_50 = (this->m_totals).assertions.failed;
  local_48 = (this->m_totals).assertions.failedButOk;
  uStack_40 = (this->m_totals).assertions.skipped;
  this->m_shouldReportUnexpected = true;
  local_d8._0_8_ = (pTVar1->lineInfo).file;
  local_d8._8_8_ = (pTVar1->lineInfo).line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_d8._0_8_;
  (this->m_lastAssertionInfo).lineInfo.line = local_d8._8_8_;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  if ((((this->m_reporter).m_ptr)->m_preferences).shouldRedirectStdOut == true) {
    RedirectedStreams::RedirectedStreams
              ((RedirectedStreams *)local_d8,redirectedCout,redirectedCerr);
    lVar7 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams((RedirectedStreams *)local_d8);
  }
  else {
    lVar7 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  local_108._16_8_ = (this->m_totals).assertions.passed - local_58;
  local_108._24_8_ = (this->m_totals).assertions.failed - uStack_50;
  local_e8 = (this->m_totals).assertions.failedButOk - local_48;
  uStack_e0 = (this->m_totals).assertions.skipped - uStack_40;
  bVar6 = testForMissingAssertions(this,(Counts *)(local_108 + 0x10));
  (*this->m_testCaseTracker->_vptr_ITracker[3])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar3 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar3;
  if (pSVar4 != pSVar3) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar4);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar3;
  }
  if (local_148 == &local_138) {
    poStack_c0 = (ostream *)local_138._M_string_length;
    local_d8._0_8_ = (string *)(local_d8 + 0x10);
  }
  else {
    local_d8._0_8_ = local_148;
  }
  local_d8._16_8_ = local_138._M_dataplus._M_p;
  local_d8._8_8_ = psVar5;
  local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffffffffff00;
  local_b8 = (ostream *)local_138.field_2._M_allocated_capacity;
  poStack_b0 = (ostream *)local_138.field_2._8_8_;
  local_a8 = (streambuf *)local_108._16_8_;
  sStack_a0 = local_108._24_8_;
  local_98 = (undefined4)local_e8;
  uStack_94 = local_e8._4_4_;
  uStack_90 = (undefined4)uStack_e0;
  uStack_8c = uStack_e0._4_4_;
  local_88 = (ostream *)((double)((ulong)(lVar8 - lVar7) / 1000) / 1000000.0);
  local_80 = bVar6;
  (*((this->m_reporter).m_ptr)->_vptr_IEventListener[0xe])();
  if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
  }
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }